

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInvertedEmissivities.unit.cpp
# Opt level: O1

void __thiscall
TestInvertedEmissivities_Test1_Test::~TestInvertedEmissivities_Test1_Test
          (TestInvertedEmissivities_Test1_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(TestInvertedEmissivities, Test1)
{
	const std::string inputFile = R"(InputInvertedEmissivites.dat)";
	OpticsParser::Parser parser;
	auto product = parser.parseFile(inputFile);

	EXPECT_NEAR(3.048, product.thickness.value(), 1e-6);
	EXPECT_NEAR(1, product.conductivity.value(), 1e-6);
	EXPECT_NEAR(0, product.IRTransmittance.value(), 1e-6);
	EXPECT_NEAR(0.84, product.frontEmissivity.value(), 1e-6);
	EXPECT_NEAR(0.5, product.backEmissivity.value(), 1e-6);
	EXPECT_EQ(102, product.nfrcid.value());
	EXPECT_EQ("", product.productName);
	EXPECT_EQ("glazing", product.productType);
	EXPECT_EQ("Monolithic", product.productSubtype);

	std::vector<OpticsParser::WLData> correctResults{{0.300, 0.0020, 0.0470, 0.0480},
													 {0.305, 0.0030, 0.0470, 0.0480},
													 {0.310, 0.0090, 0.0470, 0.0480},
													 {0.315, 0.0350, 0.0470, 0.0480},
													 {0.320, 0.1000, 0.0470, 0.0480},
													 {0.325, 0.2180, 0.0490, 0.0500}};

	auto & givenResults =
		std::get<std::vector<OpticsParser::WLData>>(product.measurements.value());
	EXPECT_EQ(correctResults.size(), givenResults.size());
	for(auto i = 0u; i < correctResults.size(); ++i)
	{
		EXPECT_NEAR(correctResults[i].wavelength, givenResults[i].wavelength, 1e-6);
		EXPECT_NEAR(
			correctResults[i].directComponent.value().tf, givenResults[i].directComponent.value().tf, 1e-6);
		EXPECT_NEAR(
			correctResults[i].directComponent.value().rf, givenResults[i].directComponent.value().rf, 1e-6);
		EXPECT_NEAR(
			correctResults[i].directComponent.value().rb, givenResults[i].directComponent.value().rb, 1e-6);
	}
}